

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O0

ENetPacket *
enet_packet_create_offset(void *data,size_t dataLength,size_t dataOffset,uint32_t flags)

{
  ENetPacket *local_38;
  ENetPacket *packet;
  uint32_t flags_local;
  size_t dataOffset_local;
  size_t dataLength_local;
  void *data_local;
  
  if ((flags & 4) == 0) {
    local_38 = (ENetPacket *)enet_malloc((dataLength + 0x28) - dataOffset);
    if (local_38 == (ENetPacket *)0x0) {
      return (ENetPacket *)0x0;
    }
    local_38->data = (uint8_t *)(local_38 + 1);
    if (data != (void *)0x0) {
      memcpy(local_38->data,(void *)((long)data + dataOffset),dataLength - dataOffset);
    }
  }
  else {
    local_38 = (ENetPacket *)enet_malloc(0x28);
    if (local_38 == (ENetPacket *)0x0) {
      return (ENetPacket *)0x0;
    }
    local_38->data = (uint8_t *)data;
  }
  local_38->referenceCount = 0;
  local_38->flags = flags;
  local_38->dataLength = (int)dataLength - (int)dataOffset;
  local_38->freeCallback = (ENetPacketFreeCallback)0x0;
  local_38->userData = (void *)0x0;
  return local_38;
}

Assistant:

ENetPacket* enet_packet_create_offset(const void* data, size_t dataLength, size_t dataOffset, uint32_t flags) {
	ENetPacket* packet;

	if (flags & ENET_PACKET_FLAG_NO_ALLOCATE) {
		packet = (ENetPacket*)enet_malloc(sizeof(ENetPacket));

		if (packet == NULL)
			return NULL;

		packet->data = (uint8_t*)data;
	}
	else {
		packet = (ENetPacket*)enet_malloc(sizeof(ENetPacket) + dataLength - dataOffset);

		if (packet == NULL)
			return NULL;

		packet->data = (uint8_t*)packet + sizeof(ENetPacket);

		if (data != NULL)
			memcpy(packet->data, (char*)data + dataOffset, dataLength - dataOffset);
	}

	packet->referenceCount = 0;
	packet->flags = flags;
	packet->dataLength = dataLength - dataOffset;
	packet->freeCallback = NULL;
	packet->userData = NULL;

	return packet;
}